

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcSC3DMCEncoder.h
# Opt level: O2

void __thiscall
o3dgc::SC3DMCEncoder<unsigned_short>::~SC3DMCEncoder(SC3DMCEncoder<unsigned_short> *this)

{
  if (this->m_normals != (Real *)0x0) {
    operator_delete__(this->m_normals);
  }
  if (this->m_quantFloatArray != (long *)0x0) {
    operator_delete__(this->m_quantFloatArray);
  }
  if (this->m_bufferAC != (uchar *)0x0) {
    operator_delete__(this->m_bufferAC);
  }
  Vector<long>::~Vector(&this->m_predictors);
  TriangleListEncoder<unsigned_short>::~TriangleListEncoder(&this->m_triangleListEncoder);
  return;
}

Assistant:

~SC3DMCEncoder(void)
                                    {
                                        delete [] m_normals;
                                        delete [] m_quantFloatArray;
                                        delete [] m_bufferAC;
                                    }